

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::
StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  Vector *col;
  unsigned_long *puVar1;
  idx_t i;
  Allocator *pAVar2;
  long lVar3;
  idx_t iVar4;
  primitive_dictionary_entry_t *ppVar5;
  InternalException *this_00;
  _func_int **extraout_RDX;
  _func_int **extraout_RDX_00;
  _func_int **pp_Var6;
  _func_int **extraout_RDX_01;
  _func_int **extraout_RDX_02;
  _func_int **extraout_RDX_03;
  _func_int **extraout_RDX_04;
  ValidityMask *chunk_end_00;
  interval_t *value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Vector *mask;
  WriteStream *ser;
  idx_t r;
  idx_t iVar8;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t input_02;
  interval_t input_03;
  uint32_t value_index;
  string local_58;
  StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
  *local_38;
  
  mask = input_column;
  ser = (WriteStream *)chunk_start;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_010f2fc5_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  col = (Vector *)input_column->data;
  chunk_end_00 = &input_column->validity;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,true>
                (col,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)temp_writer,
                 (ValidityMask *)mask,ser);
      return;
    }
    TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,false>
              (col,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)chunk_end_00,
               (ValidityMask *)temp_writer,ser);
    return;
  default:
    goto switchD_010f2fc5_caseD_1;
  case 5:
    pp_Var6 = extraout_RDX;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (pp_Var6 = (_func_int **)puVar1[iVar8 >> 6], iVar4 = iVar8,
           ((ulong)pp_Var6 >> (iVar8 & 0x3f) & 1) != 0)) {
          input_02.micros = (int64_t)pp_Var6;
          input_02._0_8_ = *(undefined8 *)(&(col->type).id_ + iVar4 * 0x10);
          local_58._0_12_ =
               ParquetIntervalOperator::
               Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                         (*(ParquetIntervalOperator **)(&col->vector_type + iVar4 * 0x10),input_02);
          DbpEncoder::BeginWrite<duckdb::ParquetIntervalTargetType>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,
                     (ParquetIntervalTargetType *)&local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar4 + 1;
          pp_Var6 = extraout_RDX_03;
          goto LAB_010f336e;
        }
        iVar8 = iVar8 + 1;
      } while (chunk_end != iVar8);
    }
    else {
LAB_010f336e:
      if (chunk_start < chunk_end) {
        p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (&(col->type).id_ + chunk_start * 0x10);
        do {
          puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) ||
             ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
            input_03.micros = (int64_t)pp_Var6;
            input_03._0_8_ = p_Var7->_M_pi;
            local_58._0_12_ =
                 ParquetIntervalOperator::
                 Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                           ((ParquetIntervalOperator *)
                            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                            (p_Var7 + -1))->_M_ptr,input_03);
            DbpEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,
                       (ParquetIntervalTargetType *)&local_58);
            pp_Var6 = extraout_RDX_04;
          }
          chunk_start = chunk_start + 1;
          p_Var7 = p_Var7 + 2;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    pp_Var6 = extraout_RDX;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (pp_Var6 = (_func_int **)puVar1[iVar8 >> 6], iVar4 = iVar8,
           ((ulong)pp_Var6 >> (iVar8 & 0x3f) & 1) != 0)) {
          input_00.micros = (int64_t)pp_Var6;
          input_00._0_8_ = *(undefined8 *)(&(col->type).id_ + iVar4 * 0x10);
          local_38 = this;
          local_58._0_12_ =
               ParquetIntervalOperator::
               Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                         (*(ParquetIntervalOperator **)(&col->vector_type + iVar4 * 0x10),input_00);
          pAVar2 = BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<duckdb::ParquetIntervalTargetType>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar2,temp_writer,
                     (ParquetIntervalTargetType *)&local_58);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar4 + 1;
          pp_Var6 = extraout_RDX_01;
          goto LAB_010f3212;
        }
        iVar8 = iVar8 + 1;
      } while (chunk_end != iVar8);
    }
    else {
LAB_010f3212:
      if (chunk_start < chunk_end) {
        p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (&(col->type).id_ + chunk_start * 0x10);
        do {
          puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) ||
             ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
            input_01.micros = (int64_t)pp_Var6;
            input_01._0_8_ = p_Var7->_M_pi;
            local_58._0_12_ =
                 ParquetIntervalOperator::
                 Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                           ((ParquetIntervalOperator *)
                            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                            (p_Var7 + -1))->_M_ptr,input_01);
            DlbaEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                      ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,
                       (ParquetIntervalTargetType *)&local_58);
            pp_Var6 = extraout_RDX_02;
          }
          chunk_start = chunk_start + 1;
          p_Var7 = p_Var7 + 2;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar8 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar4 = chunk_start;
      do {
        iVar8 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar8 = iVar4, (puVar1[iVar4 >> 6] >> (iVar4 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p._0_1_ =
               *(data_t *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_010f32c1;
        }
        iVar4 = iVar4 + 1;
      } while (chunk_end != iVar4);
    }
    else {
LAB_010f32c1:
      if (iVar8 < chunk_end) {
        value = (interval_t *)(&col->vector_type + iVar8 * 0x10);
        do {
          puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0))
          {
            ppVar5 = PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
                     ::Lookup((PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
                               *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
            local_58._M_dataplus._M_p._0_4_ = ppVar5->index;
            RleBpEncoder::WriteValue
                      ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_58);
          }
          iVar8 = iVar8 + 1;
          value = value + 1;
        } while (chunk_end != iVar8);
      }
    }
    break;
  case 9:
    pp_Var6 = extraout_RDX;
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar2 = BufferAllocator::Get
                         (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar2);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      pp_Var6 = extraout_RDX_00;
    }
    if (chunk_start < chunk_end) {
      do {
        puVar1 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) ||
           ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
          input.micros = (int64_t)pp_Var6;
          input._0_8_ = *(undefined8 *)(&(col->type).id_ + chunk_start * 0x10);
          local_58._0_12_ =
               ParquetIntervalOperator::
               Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                         (*(ParquetIntervalOperator **)(&col->vector_type + chunk_start * 0x10),
                          input);
          lVar3 = 0;
          do {
            pp_Var6 = (_func_int **)
                      ((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar3 +
                      (long)page_state_p[0x1219]._vptr_ColumnWriterPageState);
            *(undefined1 *)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + (long)pp_Var6)
                 = *(undefined1 *)((long)&local_58._M_dataplus._M_p + lVar3);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0xc);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}